

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_2::MaxViewportDimsTestCase::test
          (MaxViewportDimsTestCase *this)

{
  uint uVar1;
  StateVerifier *pSVar2;
  TestContext *pTVar3;
  RenderTarget *pRVar4;
  
  pSVar2 = this->m_verifier;
  pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar4 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar1 = pRVar4->m_width;
  pRVar4 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  (*pSVar2->_vptr_StateVerifier[8])(pSVar2,pTVar3,0xd3a,(ulong)uVar1,(ulong)(uint)pRVar4->m_height);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyIntegerGreaterOrEqual2(m_testCtx, GL_MAX_VIEWPORT_DIMS, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);
	}